

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMeshControl::ConnectedElements
          (TPZMHMeshControl *this,int64_t skeleton,pair<long,_long> *leftright,
          map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
          *ellist)

{
  size_t sVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  long lVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  int iVar7;
  _List_node_base *p_Var8;
  TPZCompElSide celside;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> allconnected;
  TPZGeoElSide gelside;
  long local_98;
  int64_t local_90;
  TPZCompElSide local_88;
  _List_base<TPZCompElSide,_std::allocator<TPZCompElSide>_> local_78;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  local_90 = skeleton;
  pTVar3 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,skeleton);
  iVar7 = ((this->fGMesh).fRef)->fPointer->fDim;
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
  if (iVar2 != iVar7 + -1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x813);
  }
  local_48.fSide = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
  local_78._M_impl._M_node._M_size = 0;
  local_48.fSide = local_48.fSide + -1;
  local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  local_78._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
  local_78._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
  local_48.fGeoEl = pTVar3;
  BuildConnectedElementList
            (this,&local_48,(list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)&local_78);
  p_Var8 = (_List_node_base *)&local_78;
  while (p_Var8 = (((_List_base<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)&p_Var8->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&local_78) {
    local_88.fEl = (TPZCompEl *)p_Var8[1]._M_next;
    local_88.fSide = *(int *)&p_Var8[1]._M_prev;
    TPZCompElSide::Reference(&local_60,&local_88);
    iVar7 = (int)(this->fGeoToMHMDomain).super_TPZVec<long>.fStore[(local_60.fGeoEl)->fIndex];
    lVar4 = (long)iVar7;
    if (lVar4 == leftright->first) {
      local_98 = lVar4;
      pmVar5 = std::
               map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
               ::operator[](ellist,&local_98);
      std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::push_back(pmVar5,&local_88)
      ;
    }
    else if (lVar4 == leftright->second) {
      local_98 = lVar4;
      pmVar5 = std::
               map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
               ::operator[](ellist,&local_98);
      std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::push_back(pmVar5,&local_88)
      ;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"I dont understand leftright : ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      poVar6 = std::operator<<(poVar6," mhm_domain ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  sVar1 = (ellist->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x843);
  }
  if (sVar1 != 1 && leftright->second == local_90) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x847);
  }
  if ((leftright->second != local_90) && (sVar1 != 2)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x84c);
  }
  std::__cxx11::_List_base<TPZCompElSide,_std::allocator<TPZCompElSide>_>::_M_clear(&local_78);
  return;
}

Assistant:

void TPZMHMeshControl::ConnectedElements(int64_t skeleton, std::pair<int64_t,int64_t> &leftright, std::map<int64_t, std::list<TPZCompElSide> > &ellist)
{
    TPZGeoEl *gelskeleton = fGMesh->Element(skeleton);
    int meshdim = fGMesh->Dimension();
    if (gelskeleton->Dimension() != meshdim-1) {
        DebugStop();
    }
    TPZGeoElSide skelside(gelskeleton,gelskeleton->NSides()-1);

    std::list<TPZCompElSide> allconnected;
    BuildConnectedElementList(skelside, allconnected);
    
#ifdef PZDEBUG
    // verify if the acumulated area of allconnected is the area of the element
    REAL area = gelskeleton->SideArea(gelskeleton->NSides()-1);
    REAL listarea = 0.;
    for(auto it : allconnected)
    {
        TPZGeoElSide gside = it.Reference();
        listarea += gside.Area();
    }
    REAL diff = fabs(area-listarea);
    REAL diff2 = fabs(2*area - listarea);
    if(diff > 1.e-3*area && diff2 >= 1.e-3*area)
    {
        std::cout << "The area of the connected elements does not correspond to the area " <<
        "of the skeleton element area = " << area << " listarea = " << listarea <<
        " diff/area = " << diff/area << " diff2/area " << diff2/area << std::endl;
    }
#endif
    
    for(auto celside : allconnected)
    {
        TPZGeoElSide gelside = celside.Reference();
        TPZGeoEl *gel = gelside.Element();
        int64_t gelindex = gel->Index();
        int mhm_domain = fGeoToMHMDomain[gelindex];
        if(mhm_domain == leftright.first)
        {
            ellist[mhm_domain].push_back(celside);
        }
        else if(mhm_domain == leftright.second)
        {
            ellist[mhm_domain].push_back(celside);
        }
        else
        {
            std::cout << "I dont understand leftright : " << leftright.first << " " <<
            leftright.second << " mhm_domain " << mhm_domain << std::endl;
        }
    }
    // a skeleton element with no computational elements is a bug
    if (ellist.size() == 0) {
        DebugStop();
    }
    // if the skeleton is boundary and if there are more than one subdomain, it is a bug
    if (skeleton == leftright.second && ellist.size() != 1) {
        DebugStop();
    }
    // if the skeleton is not boundary then there must be exactly two subdomains connected
    if(skeleton != leftright.second && ellist.size() != 2)
    {
        DebugStop();
    }
}